

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_enc.c
# Opt level: O0

int CompressAlphaJob(void *arg1,void *unused)

{
  int iVar1;
  long in_RDI;
  uint8_t **unaff_retaddr;
  int in_stack_00000008;
  int in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000014;
  WEBP_FILTER_TYPE filter;
  int effort_level;
  size_t alpha_size;
  uint8_t *alpha_data;
  WebPConfig *config;
  VP8Encoder *enc;
  uint local_4;
  
  iVar1 = EncodeAlpha(_filter,in_stack_00000014,in_stack_00000010,in_stack_0000000c,
                      in_stack_00000008,unaff_retaddr,(size_t *)unused);
  if (iVar1 != 0) {
    *(undefined4 *)(in_RDI + 0x228) = 0;
    *(undefined8 *)(in_RDI + 0x220) = 0;
  }
  local_4 = (uint)(iVar1 != 0);
  return local_4;
}

Assistant:

static int CompressAlphaJob(void* arg1, void* unused) {
  VP8Encoder* const enc = (VP8Encoder*)arg1;
  const WebPConfig* config = enc->config_;
  uint8_t* alpha_data = NULL;
  size_t alpha_size = 0;
  const int effort_level = config->method;  // maps to [0..6]
  const WEBP_FILTER_TYPE filter =
      (config->alpha_filtering == 0) ? WEBP_FILTER_NONE :
      (config->alpha_filtering == 1) ? WEBP_FILTER_FAST :
                                       WEBP_FILTER_BEST;
  if (!EncodeAlpha(enc, config->alpha_quality, config->alpha_compression,
                   filter, effort_level, &alpha_data, &alpha_size)) {
    return 0;
  }
  if (alpha_size != (uint32_t)alpha_size) {  // Soundness check.
    WebPSafeFree(alpha_data);
    return 0;
  }
  enc->alpha_data_size_ = (uint32_t)alpha_size;
  enc->alpha_data_ = alpha_data;
  (void)unused;
  return 1;
}